

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_CutIsContainedOrder(int *pBase,int *pCut)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_30;
  int local_2c;
  int k;
  int i;
  int nSizeC;
  int nSizeB;
  int *pCut_local;
  int *pBase_local;
  
  iVar1 = Jf_CutSize(pBase);
  iVar2 = Jf_CutSize(pCut);
  if (iVar1 == iVar2) {
    for (local_2c = 1; local_2c <= iVar1; local_2c = local_2c + 1) {
      if (pBase[local_2c] != pCut[local_2c]) {
        return 0;
      }
    }
    pBase_local._4_4_ = 1;
  }
  else {
    if (iVar1 <= iVar2) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x236,"int Jf_CutIsContainedOrder(int *, int *)");
    }
    local_30 = 1;
    for (local_2c = 1; local_2c <= iVar1; local_2c = local_2c + 1) {
      if (pCut[local_30] < pBase[local_2c]) {
        return 0;
      }
      if ((pBase[local_2c] == pCut[local_30]) &&
         (bVar3 = local_30 == iVar2, local_30 = local_30 + 1, bVar3)) {
        return 1;
      }
    }
    pBase_local._4_4_ = 0;
  }
  return pBase_local._4_4_;
}

Assistant:

static inline int Jf_CutIsContainedOrder( int * pBase, int * pCut ) // check if pCut is contained pBase
{
    int nSizeB = Jf_CutSize(pBase);
    int nSizeC = Jf_CutSize(pCut);
    int i, k;
    if ( nSizeB == nSizeC )
    {
        for ( i = 1; i <= nSizeB; i++ )
            if ( pBase[i] != pCut[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    for ( i = k = 1; i <= nSizeB; i++ )
    {
        if ( pBase[i] > pCut[k] )
            return 0;
        if ( pBase[i] == pCut[k] )
        {
            if ( k++ == nSizeC )
                return 1;
        }
    }
    return 0;
}